

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SectionTracker *pSVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_99;
  SectionTracker *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_90 [2];
  string local_80;
  void *local_60;
  NameAndLocation local_58;
  SourceLineInfo local_28;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"{root}","");
  local_28.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/catch.hpp";
  local_28.line = 0x3824;
  NameAndLocation::NameAndLocation(&local_58,&local_80,&local_28);
  local_60 = (void *)0x0;
  local_98 = (SectionTracker *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Catch::TestCaseTracking::SectionTracker,std::allocator<Catch::TestCaseTracking::SectionTracker>,Catch::TestCaseTracking::NameAndLocation,Catch::TestCaseTracking::TrackerContext&,decltype(nullptr)>
            (a_Stack_90,&local_98,(allocator<Catch::TestCaseTracking::SectionTracker> *)&local_99,
             &local_58,this,&local_60);
  _Var2._M_pi = a_Stack_90[0]._M_pi;
  pSVar1 = local_98;
  local_98 = (SectionTracker *)0x0;
  a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_rootTracker).
            super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_rootTracker).
  super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pSVar1;
  (this->m_rootTracker).
  super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (a_Stack_90[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_90[0]._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != &local_58.name.field_2) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  this->m_currentTracker = (ITracker *)0x0;
  this->m_runState = Executing;
  return (this->m_rootTracker).
         super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
}

Assistant:

ITracker& TrackerContext::startRun() {
        m_rootTracker = std::make_shared<SectionTracker>( NameAndLocation( "{root}", CATCH_INTERNAL_LINEINFO ), *this, nullptr );
        m_currentTracker = nullptr;
        m_runState = Executing;
        return *m_rootTracker;
    }